

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

image_u8 * __thiscall
crnlib::mip_level::get_unpacked_image(mip_level *this,image_u8 *tmp,uint unpack_flags)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  dxt_image *this_00;
  orientation_flags_t oVar1;
  
  other = this->m_pImage;
  this_00 = this->m_pDXTImage;
  if (other == (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0 && this_00 == (dxt_image *)0x0)
  {
    tmp = (image_u8 *)0x0;
  }
  else {
    if (this_00 == (dxt_image *)0x0) {
      if ((unpack_flags & 2) == 0) {
        return other;
      }
      if ((this->m_orient_flags & (cOrientationFlagYFlipped|cOrientationFlagXFlipped)) ==
          cDefaultOrientationFlags) {
        return other;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::operator=(tmp,other);
    }
    else {
      dxt_image::unpack(this_00,tmp);
      tmp->m_comp_flags = this->m_comp_flags;
      if ((unpack_flags & 1) != 0) {
        uncook_image(this,tmp);
      }
    }
    if ((unpack_flags & 2) != 0) {
      oVar1 = this->m_orient_flags;
      if ((oVar1 & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_x(tmp);
        oVar1 = this->m_orient_flags;
      }
      if ((oVar1 & cOrientationFlagYFlipped) != cDefaultOrientationFlags) {
        image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(tmp);
      }
    }
  }
  return tmp;
}

Assistant:

image_u8* mip_level::get_unpacked_image(image_u8& tmp, uint unpack_flags) const {
  if (!is_valid())
    return NULL;

  if (m_pDXTImage) {
    m_pDXTImage->unpack(tmp);

    tmp.set_comp_flags(m_comp_flags);

    if (unpack_flags & cUnpackFlagUncook)
      uncook_image(tmp);
  } else if ((unpack_flags & cUnpackFlagUnflip) && (m_orient_flags & (cOrientationFlagXFlipped | cOrientationFlagYFlipped)))
    tmp = *m_pImage;
  else
    return m_pImage;

  if (unpack_flags & cUnpackFlagUnflip) {
    if (m_orient_flags & cOrientationFlagXFlipped)
      tmp.flip_x();
    if (m_orient_flags & cOrientationFlagYFlipped)
      tmp.flip_y();
  }

  return &tmp;
}